

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  int r;
  long lVar2;
  undefined4 in_register_00000014;
  long lVar3;
  float *this;
  Type in0;
  Matrix<float,_4,_3> retVal;
  MatrixCaseUtils local_94 [12];
  Mat3x4 local_88;
  VecAccess<float,_4,_3> local_58;
  Mat3x4 local_40;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
              (&local_88,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_3>::Matrix(&local_88,(float *)sr::(anonymous_namespace)::s_constInMat3x4);
  }
  this = (float *)&local_40;
  tcu::Matrix<float,_4,_3>::Matrix((Matrix<float,_4,_3> *)this);
  pfVar1 = (float *)&local_88;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0x10) {
      *(uint *)((long)this + lVar3) = *(uint *)((long)pfVar1 + lVar3) ^ 0x80000000;
    }
    this = this + 1;
    pfVar1 = pfVar1 + 1;
  }
  reduceToVec3(local_94,&local_40);
  local_58.m_vector = &evalCtx->color;
  local_58.m_index[0] = 0;
  local_58.m_index[1] = 1;
  local_58.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,(Vector<float,_3> *)local_94);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}